

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O2

App * __thiscall CLI::App::ignore_case(App *this,bool value)

{
  App *pAVar1;
  pointer puVar2;
  bool bVar3;
  OptionAlreadyAdded *this_00;
  pointer puVar4;
  string local_90;
  string local_70;
  string local_50;
  
  this->ignore_case_ = value;
  pAVar1 = this->parent_;
  if (pAVar1 != (App *)0x0) {
    puVar2 = (pAVar1->subcommands_).
             super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar4 = (pAVar1->subcommands_).
                  super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar4 != puVar2; puVar4 = puVar4 + 1)
    {
      pAVar1 = (puVar4->_M_t).super___uniq_ptr_impl<CLI::App,_std::default_delete<CLI::App>_>._M_t.
               super__Tuple_impl<0UL,_CLI::App_*,_std::default_delete<CLI::App>_>.
               super__Head_base<0UL,_CLI::App_*,_false>._M_head_impl;
      if (pAVar1 != this) {
        ::std::__cxx11::string::string((string *)&local_90,(string *)&pAVar1->name_);
        bVar3 = check_name(this,&local_90);
        if (bVar3) {
          ::std::__cxx11::string::~string((string *)&local_90);
LAB_001171b5:
          this_00 = (OptionAlreadyAdded *)__cxa_allocate_exception(0x38);
          ::std::__cxx11::string::string
                    ((string *)&local_70,
                     (string *)
                     &((puVar4->_M_t).
                       super___uniq_ptr_impl<CLI::App,_std::default_delete<CLI::App>_>._M_t.
                       super__Tuple_impl<0UL,_CLI::App_*,_std::default_delete<CLI::App>_>.
                       super__Head_base<0UL,_CLI::App_*,_false>._M_head_impl)->name_);
          OptionAlreadyAdded::OptionAlreadyAdded(this_00,&local_70);
          __cxa_throw(this_00,&OptionAlreadyAdded::typeinfo,Error::~Error);
        }
        pAVar1 = (puVar4->_M_t).super___uniq_ptr_impl<CLI::App,_std::default_delete<CLI::App>_>._M_t
                 .super__Tuple_impl<0UL,_CLI::App_*,_std::default_delete<CLI::App>_>.
                 super__Head_base<0UL,_CLI::App_*,_false>._M_head_impl;
        ::std::__cxx11::string::string((string *)&local_50,(string *)&this->name_);
        bVar3 = check_name(pAVar1,&local_50);
        ::std::__cxx11::string::~string((string *)&local_50);
        ::std::__cxx11::string::~string((string *)&local_90);
        if (bVar3) goto LAB_001171b5;
      }
    }
  }
  return this;
}

Assistant:

App *ignore_case(bool value = true) {
        ignore_case_ = value;
        if(parent_ != nullptr) {
            for(const auto &subc : parent_->subcommands_) {
                if(subc.get() != this && (this->check_name(subc->name_) || subc->check_name(this->name_)))
                    throw OptionAlreadyAdded(subc->name_);
            }
        }
        return this;
    }